

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  _Bind<void_(*(int,_int))(int,_int)> *__f;
  _Bind<void_(*(double,_double))(double,_double)> *__f_00;
  anon_class_8_1_6971b95b local_238;
  function<void_()> local_230;
  reference_wrapper<int> local_210;
  double local_208;
  double local_200;
  _func_void_int_int_int_ptr *local_1f8;
  type local_1f0;
  function<void_()> local_1d0;
  int local_1ac;
  undefined1 local_1a8 [4];
  int result;
  double local_188;
  double local_180;
  _func_void_double_double *local_178;
  type local_170;
  function<void_()> local_158;
  undefined1 local_138 [8];
  _Bind<void_(*())()> local_130;
  function<void_()> local_120;
  double local_100;
  double local_f8;
  _func_void_double_double *local_f0;
  type local_e8;
  function<void_()> local_d0;
  undefined1 local_b0 [8];
  _Bind<void_(*())()> local_a8;
  function<void_()> local_98;
  undefined4 local_78;
  int local_74;
  code *local_70;
  _Bind<void_(*(int,_int))(int,_int)> local_68;
  function<void_()> local_58;
  undefined1 local_28 [8];
  ThreadPool pool;
  
  pool._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  ThreadPool::ThreadPool((ThreadPool *)local_28);
  ThreadPool::init((ThreadPool *)local_28,(EVP_PKEY_CTX *)0x5);
  local_70 = test1;
  local_74 = 1;
  local_78 = 2;
  std::bind<void(*)(int,int),int,int>(&local_68._M_f,(int *)&local_70,&local_74);
  __f = &local_68;
  std::function<void()>::function<std::_Bind<void(*(int,int))(int,int)>,void>
            ((function<void()> *)&local_58,__f);
  local_b0 = (undefined1  [8])callback;
  local_a8._M_f = (_func_void *)std::bind<void(*)()>((type *)local_b0,(_func_void **)__f);
  std::function<void()>::function<std::_Bind<void(*())()>,void>
            ((function<void()> *)&local_98,&local_a8);
  ThreadPool::add((ThreadPool *)local_28,&local_58,&local_98);
  std::function<void_()>::~function(&local_98);
  std::function<void_()>::~function(&local_58);
  local_f0 = test2;
  local_f8 = 1.0;
  local_100 = 2.0;
  std::bind<void(*)(double,double),double,double>(&local_e8,&local_f0,&local_f8,&local_100);
  __f_00 = &local_e8;
  std::function<void()>::function<std::_Bind<void(*(double,double))(double,double)>,void>
            ((function<void()> *)&local_d0,__f_00);
  local_138 = (undefined1  [8])callback;
  local_130._M_f = (_func_void *)std::bind<void(*)()>((type *)local_138,(_func_void **)__f_00);
  std::function<void()>::function<std::_Bind<void(*())()>,void>
            ((function<void()> *)&local_120,&local_130);
  ThreadPool::add((ThreadPool *)local_28,&local_d0,&local_120);
  std::function<void_()>::~function(&local_120);
  std::function<void_()>::~function(&local_d0);
  local_178 = test2;
  local_180 = 1.0;
  local_188 = 2.0;
  std::bind<void(*)(double,double),double,double>(&local_170,&local_178,&local_180,&local_188);
  std::function<void()>::function<std::_Bind<void(*(double,double))(double,double)>,void>
            ((function<void()> *)&local_158,&local_170);
  std::function<void_()>::function((function<void_()> *)local_1a8,(nullptr_t)0x0);
  ThreadPool::add((ThreadPool *)local_28,&local_158,(function<void_()> *)local_1a8);
  std::function<void_()>::~function((function<void_()> *)local_1a8);
  std::function<void_()>::~function(&local_158);
  local_1ac = 0;
  local_1f8 = test3;
  local_200 = 1.0;
  local_208 = 2.0;
  local_210 = std::ref<int>(&local_1ac);
  std::bind<void(*)(int,int,int&),double,double,std::reference_wrapper<int>>
            (&local_1f0,&local_1f8,&local_200,&local_208,&local_210);
  std::function<void()>::
  function<std::_Bind<void(*(double,double,std::reference_wrapper<int>))(int,int,int&)>,void>
            ((function<void()> *)&local_1d0,&local_1f0);
  local_238.result = &local_1ac;
  std::function<void()>::function<main::__0,void>((function<void()> *)&local_230,&local_238);
  ThreadPool::add((ThreadPool *)local_28,&local_1d0,&local_230);
  std::function<void_()>::~function(&local_230);
  std::function<void_()>::~function(&local_1d0);
  system("pause");
  pool._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  ThreadPool::~ThreadPool((ThreadPool *)local_28);
  return pool._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	ThreadPool pool;
	pool.init(5);
	pool.add(std::bind(&test1, 1, 2), std::bind(&callback));
	pool.add(std::bind(&test2, 1.0, 2.0), std::bind(&callback));
	pool.add(std::bind(&test2, 1.0, 2.0));

	//Add a unit test that asynchronously passes the reference and gets the asynchronous reference result in the callback function.
	int result = 0;
	pool.add(std::bind(&test3, 1.0, 2.0, std::ref(result)), [&]()
	{
		std::cout << "result = " << result << std::endl;
	});

	system("pause");
	return 1;
}